

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

int Abc_TgPermPhase(Abc_TgMan_t *pMan,int iVar)

{
  byte bVar1;
  word *pwVar2;
  word wVar3;
  uint uVar4;
  long lVar5;
  word *pwVar6;
  byte bVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  word *pwVar14;
  ulong uVar15;
  
  uVar4 = 1 << ((char)pMan->nVars - 6U & 0x1f);
  if (pMan->nVars < 7) {
    uVar4 = 1;
  }
  uVar12 = (ulong)uVar4;
  bVar1 = pMan->pPermTRev[iVar];
  iVar11 = (int)(char)bVar1;
  pwVar2 = pMan->pTruth;
  if (0 < (int)uVar4) {
    lVar8 = 0;
    do {
      *(undefined8 *)((long)Abc_TgPermPhase::pCopy + lVar8) = *(undefined8 *)((long)pwVar2 + lVar8);
      lVar8 = lVar8 + 8;
    } while (uVar12 * 8 - lVar8 != 0);
  }
  if (uVar4 == 1) {
    bVar7 = (byte)(1 << (bVar1 & 0x1f));
    Abc_TgPermPhase::pCopy[0] =
         (s_Truths6[iVar11] & Abc_TgPermPhase::pCopy[0]) >> (bVar7 & 0x3f) |
         Abc_TgPermPhase::pCopy[0] << (bVar7 & 0x3f) & s_Truths6[iVar11];
  }
  else if ((char)bVar1 < '\x06') {
    if (0 < (int)uVar4) {
      uVar13 = s_Truths6[iVar11];
      lVar8 = 0;
      do {
        bVar7 = (byte)(1 << (bVar1 & 0x1f));
        *(ulong *)((long)Abc_TgPermPhase::pCopy + lVar8) =
             (*(ulong *)((long)Abc_TgPermPhase::pCopy + lVar8) & uVar13) >> (bVar7 & 0x3f) |
             *(ulong *)((long)Abc_TgPermPhase::pCopy + lVar8) << (bVar7 & 0x3f) & uVar13;
        lVar8 = lVar8 + 8;
      } while (uVar12 * 8 - lVar8 != 0);
    }
  }
  else if (0 < (int)uVar4) {
    pwVar6 = Abc_TgPermPhase::pCopy;
    bVar7 = (byte)(iVar11 + -6);
    uVar10 = 1 << (bVar7 & 0x1f);
    iVar9 = 2 << (bVar7 & 0x1f);
    uVar13 = 1;
    if (1 < (int)uVar10) {
      uVar13 = (ulong)uVar10;
    }
    pwVar14 = Abc_TgPermPhase::pCopy + (int)uVar10;
    do {
      if (iVar11 + -6 != 0x1f) {
        uVar15 = 0;
        do {
          wVar3 = pwVar6[uVar15];
          pwVar6[uVar15] = pwVar14[uVar15];
          pwVar14[uVar15] = wVar3;
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      pwVar6 = pwVar6 + iVar9;
      pwVar14 = pwVar14 + iVar9;
    } while (pwVar6 < Abc_TgPermPhase::pCopy + (int)uVar4);
  }
  iVar11 = 0;
  uVar13 = uVar12;
  do {
    if ((int)uVar13 < 1) {
      return 0;
    }
    lVar8 = uVar13 + 0x3ff;
    lVar5 = uVar13 - 1;
    uVar13 = uVar13 - 1;
  } while (pwVar2[lVar5] == Abc_TgSymGroupPerm::pBest[lVar8]);
  if (Abc_TgSymGroupPerm::pBest[lVar8] <= pwVar2[lVar5]) {
    if (0 < (int)uVar4) {
      lVar8 = 0;
      do {
        *(undefined8 *)((long)pwVar2 + lVar8) =
             *(undefined8 *)((long)Abc_TgPermPhase::pCopy + lVar8);
        lVar8 = lVar8 + 8;
      } while (uVar12 << 3 != lVar8);
    }
    pMan->uPhase = pMan->uPhase ^ 1 << (bVar1 & 0x1f);
    iVar11 = 0x10;
  }
  return iVar11;
}

Assistant:

static int Abc_TgPermPhase(Abc_TgMan_t* pMan, int iVar)
{
    static word pCopy[1024];
    int nWords = Abc_TtWordNum(pMan->nVars);
    int ivp = pMan->pPermTRev[iVar];
    Abc_TtCopy(pCopy, pMan->pTruth, nWords, 0);
    Abc_TtFlip(pCopy, nWords, ivp);
    if (Abc_TtCompareRev(pMan->pTruth, pCopy, nWords) == 1)
    {
        Abc_TtCopy(pMan->pTruth, pCopy, nWords, 0);
        pMan->uPhase ^= 1 << ivp;
        return 16;
    }
    return 0;
}